

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IStreamingReporterPtr __thiscall
Catch::anon_unknown_1::createReporter(anon_unknown_1 *this,string *reporterName,IConfigPtr *config)

{
  bool bVar1;
  int iVar2;
  IRegistryHub *pIVar3;
  undefined4 extraout_var;
  ReusableStringStream *pRVar4;
  ReusableStringStream local_60;
  string local_48;
  undefined1 local_21;
  IConfigPtr *local_20;
  IConfigPtr *config_local;
  string *reporterName_local;
  IStreamingReporterPtr *reporter;
  
  local_21 = 0;
  local_20 = config;
  config_local = (IConfigPtr *)reporterName;
  reporterName_local = (string *)this;
  pIVar3 = getRegistryHub();
  iVar2 = (*pIVar3->_vptr_IRegistryHub[2])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))
            (this,(long *)CONCAT44(extraout_var,iVar2),config_local,local_20);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
  if (bVar1) {
    return (__uniq_ptr_data<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>,_true,_true>
            )(__uniq_ptr_data<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>,_true,_true>
              )this;
  }
  ReusableStringStream::ReusableStringStream(&local_60);
  pRVar4 = ReusableStringStream::operator<<
                     (&local_60,(char (*) [36])"No reporter registered with name: \'");
  pRVar4 = ReusableStringStream::operator<<
                     (pRVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             config_local);
  pRVar4 = ReusableStringStream::operator<<(pRVar4,(char (*) [2])0x4124f8);
  ReusableStringStream::str_abi_cxx11_(&local_48,pRVar4);
  throw_domain_error(&local_48);
}

Assistant:

IStreamingReporterPtr createReporter(std::string const& reporterName, IConfigPtr const& config) {
            auto reporter = Catch::getRegistryHub().getReporterRegistry().create(reporterName, config);
            CATCH_ENFORCE(reporter, "No reporter registered with name: '" << reporterName << "'");

            return reporter;
        }